

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void PeleLM::init_once(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iVar1;
  Real RVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  AdvectionForm *pAVar7;
  int *piVar8;
  double *pdVar9;
  long lVar10;
  Long LVar11;
  StateDescriptor *this;
  Print *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  mapped_type *i_00;
  int j;
  int i_4;
  int ydot_good;
  string ppStr_1;
  int i_3;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otherKeys;
  string ppStr;
  int i_2;
  ParmParse pp;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  specNames;
  int i_1;
  int diffuse_spec;
  int i;
  int tRhoRT;
  int tRhoH;
  int have_temp;
  int tTemp;
  int dummy_State_Type;
  allocator_type *in_stack_fffffffffffff318;
  Print *in_stack_fffffffffffff320;
  allocator *paVar13;
  string *in_stack_fffffffffffff328;
  ParmParse *in_stack_fffffffffffff330;
  string *in_stack_fffffffffffff338;
  allocator *in_stack_fffffffffffff340;
  ostream *in_stack_fffffffffffff348;
  Print *in_stack_fffffffffffff350;
  key_type *in_stack_fffffffffffff358;
  Print *in_stack_fffffffffffff360;
  undefined8 in_stack_fffffffffffff388;
  Print *in_stack_fffffffffffff390;
  char *in_stack_fffffffffffff398;
  ParmParse *in_stack_fffffffffffff3a0;
  Print *in_stack_fffffffffffff3a8;
  Print *in_stack_fffffffffffff3b0;
  char *in_stack_fffffffffffff3b8;
  ParmParse *in_stack_fffffffffffff3c0;
  bool local_be9;
  string *local_b88;
  undefined1 *puVar14;
  undefined6 in_stack_fffffffffffff4f8;
  undefined1 uVar15;
  bool local_af2;
  bool local_ae2;
  bool local_ae1;
  allocator local_ac9;
  char *in_stack_fffffffffffff538;
  int in_stack_fffffffffffff544;
  char *in_stack_fffffffffffff548;
  char *in_stack_fffffffffffff550;
  allocator local_aa1;
  string local_aa0 [39];
  allocator local_a79;
  string local_a78 [32];
  string local_a58 [32];
  int local_a38;
  undefined1 local_a31 [40];
  undefined1 local_a09;
  allocator local_879;
  string local_878 [39];
  allocator local_851;
  string local_850 [32];
  string local_830 [39];
  undefined1 local_809 [37];
  int local_7e4;
  undefined1 local_7dd;
  undefined4 local_7dc;
  allocator local_649;
  string local_648 [39];
  undefined1 local_621;
  uint local_310;
  allocator local_309;
  string local_308 [32];
  string local_2e8 [36];
  int local_2c4;
  undefined1 local_2bc;
  allocator local_2bb;
  allocator local_2ba;
  allocator local_2b9;
  string *local_2b8;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string *local_250;
  undefined8 local_248;
  allocator local_221;
  string local_220 [32];
  string local_200 [32];
  int local_1e0;
  allocator local_1d9;
  string local_1d8 [120];
  undefined1 local_160 [24];
  undefined8 local_148;
  int local_140;
  int local_13c;
  int local_138;
  allocator local_131;
  string local_130 [32];
  int local_110;
  byte local_10b;
  byte local_10a;
  allocator local_109;
  string local_108 [32];
  int local_e8;
  allocator local_d1;
  string local_d0 [36];
  uint local_ac;
  int local_a8;
  int local_a4;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined8 local_80;
  undefined4 local_74;
  char *local_70;
  char *local_68;
  undefined8 local_60;
  undefined4 local_54;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  undefined4 local_34;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_a8 = -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"temp",&local_d1);
  bVar3 = amrex::AmrLevel::isStateVariable
                    (in_stack_fffffffffffff338,(int *)in_stack_fffffffffffff330,
                     (int *)in_stack_fffffffffffff328);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_ac = (uint)bVar3;
  if (local_a8 != NavierStokesBase::Temp) {
    local_28 = "tTemp == Temp";
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp";
    local_34 = 0x438;
    local_40 = 0;
    amrex::Assert_host(in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff544
                       ,in_stack_fffffffffffff538);
  }
  local_ae1 = local_ac != 0 && local_a4 == 0;
  local_ac = (uint)local_ae1;
  local_e8 = -1;
  local_10a = 0;
  local_10b = 0;
  local_ae2 = false;
  if (local_ac != 0) {
    std::allocator<char>::allocator();
    local_10a = 1;
    std::__cxx11::string::string(local_108,"rhoh",&local_109);
    local_10b = 1;
    local_ae2 = amrex::AmrLevel::isStateVariable
                          (in_stack_fffffffffffff338,(int *)in_stack_fffffffffffff330,
                           (int *)in_stack_fffffffffffff328);
  }
  local_ac = (uint)local_ae2;
  if ((local_10b & 1) != 0) {
    std::__cxx11::string::~string(local_108);
  }
  if ((local_10a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  if (local_e8 != RhoH) {
    local_48 = "tRhoH == RhoH";
    local_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp";
    local_54 = 0x43d;
    local_60 = 0;
    amrex::Assert_host(in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff544
                       ,in_stack_fffffffffffff538);
  }
  local_af2 = local_ac != 0 && local_a4 == 0;
  local_ac = (uint)local_af2;
  local_110 = -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"RhoRT",&local_131);
  uVar4 = amrex::AmrLevel::isStateVariable
                    (in_stack_fffffffffffff338,(int *)in_stack_fffffffffffff330,
                     (int *)in_stack_fffffffffffff328);
  have_rhort = (int)(byte)uVar4;
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  if (local_110 != RhoRT) {
    local_68 = "tRhoRT == RhoRT";
    local_70 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp";
    local_74 = 0x442;
    local_80 = 0;
    amrex::Assert_host(in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff544
                       ,in_stack_fffffffffffff538);
  }
  uVar15 = have_rhort != 0 && local_a4 == 0;
  have_rhort = (int)(byte)uVar15;
  if (local_ac == 0) {
    local_88 = "PeleLM::init_once(): RhoH & Temp must both be the state";
    amrex::Abort_host((char *)in_stack_fffffffffffff330);
  }
  if (NavierStokesBase::Temp < RhoH) {
    local_90 = "PeleLM::init_once(): must have RhoH < Temp";
    amrex::Abort_host((char *)in_stack_fffffffffffff330);
  }
  pAVar7 = amrex::Vector<AdvectionForm,_std::allocator<AdvectionForm>_>::operator[]
                     ((Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *)
                      in_stack_fffffffffffff320,(size_type)in_stack_fffffffffffff318);
  if (*pAVar7 == Conservative) {
    local_98 = "PeleLM::init_once(): Temp must be non-conservative";
    amrex::Abort_host((char *)in_stack_fffffffffffff330);
  }
  pAVar7 = amrex::Vector<AdvectionForm,_std::allocator<AdvectionForm>_>::operator[]
                     ((Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *)
                      in_stack_fffffffffffff320,(size_type)in_stack_fffffffffffff318);
  if (*pAVar7 != Conservative) {
    local_a0 = "PeleLM::init_once(): RhoH must be conservative";
    amrex::Abort_host((char *)in_stack_fffffffffffff330);
  }
  last_spec = first_spec + 0x14;
  for (local_138 = first_spec; local_138 <= last_spec; local_138 = local_138 + 1) {
    pAVar7 = amrex::Vector<AdvectionForm,_std::allocator<AdvectionForm>_>::operator[]
                       ((Vector<AdvectionForm,_std::allocator<AdvectionForm>_> *)
                        in_stack_fffffffffffff320,(size_type)in_stack_fffffffffffff318);
    if (*pAVar7 != Conservative) {
      local_8 = "PeleLM::init_once: species must be conservative";
      amrex::Error_host((char *)in_stack_fffffffffffff330);
    }
  }
  piVar8 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff320,
                      (size_type)in_stack_fffffffffffff318);
  local_13c = *piVar8;
  local_140 = first_spec;
  while (local_140 = local_140 + 1, local_140 <= last_spec) {
    piVar8 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff320,
                        (size_type)in_stack_fffffffffffff318);
    if (*piVar8 != local_13c) {
      local_10 = "PeleLM::init_once: Le != 1; diffuse";
      amrex::Error_host((char *)in_stack_fffffffffffff330);
    }
  }
  local_148 = 0xbff0000000000000;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff350,
             (size_type)in_stack_fffffffffffff348,(value_type_conflict1 *)in_stack_fffffffffffff340)
  ;
  RVar2 = typical_RhoH_value_default;
  pdVar9 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                     ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff320,
                      (size_type)in_stack_fffffffffffff318);
  *pdVar9 = RVar2;
  puVar14 = local_160;
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4e4fcd);
  pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
            ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x4e4fda);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"ht",&local_1d9);
  amrex::ParmParse::ParmParse(in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  for (local_1e0 = 0; local_1e0 < 0x15; local_1e0 = local_1e0 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"typValY_",&local_221);
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff320,(size_type)in_stack_fffffffffffff318);
    std::operator+(in_stack_fffffffffffff328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff320);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    std::__cxx11::string::c_str();
    iVar5 = amrex::ParmParse::countval
                      (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,
                       (int)((ulong)in_stack_fffffffffffff3b0 >> 0x20));
    if (0 < iVar5) {
      std::__cxx11::string::c_str();
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff320,(size_type)in_stack_fffffffffffff318);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)in_stack_fffffffffffff360,in_stack_fffffffffffff358);
      amrex::ParmParse::get
                (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                 (double *)in_stack_fffffffffffff390,(int)((ulong)in_stack_fffffffffffff388 >> 0x20)
                );
    }
    std::__cxx11::string::~string(local_200);
  }
  local_2bc = 1;
  local_2b8 = local_2b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"Temp",&local_2b9);
  local_2b8 = local_290;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"RhoH",&local_2ba);
  local_2b8 = local_270;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"Vel",&local_2bb);
  local_2bc = 0;
  local_250 = local_2b0;
  local_248 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x4e538f);
  iVar1._M_len = (size_type)in_stack_fffffffffffff330;
  iVar1._M_array = in_stack_fffffffffffff328;
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff320,iVar1,in_stack_fffffffffffff318);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x4e53c3);
  local_b88 = (string *)&local_250;
  do {
    local_b88 = local_b88 + -0x20;
    std::__cxx11::string::~string(local_b88);
  } while (local_b88 != local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2bb);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ba);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  for (local_2c4 = 0; lVar10 = (long)local_2c4,
      LVar11 = amrex::
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x4e5464), iVar5 = RhoYdot_Type, lVar10 < LVar11; local_2c4 = local_2c4 + 1
      ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_308,"typVal_",&local_309);
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff320,(size_type)in_stack_fffffffffffff318);
    std::operator+(in_stack_fffffffffffff328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff320);
    std::__cxx11::string::~string(local_308);
    std::allocator<char>::~allocator((allocator<char> *)&local_309);
    std::__cxx11::string::c_str();
    iVar5 = amrex::ParmParse::countval
                      (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8,
                       (int)((ulong)in_stack_fffffffffffff3b0 >> 0x20));
    if (0 < iVar5) {
      std::__cxx11::string::c_str();
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff320,(size_type)in_stack_fffffffffffff318);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)in_stack_fffffffffffff360,in_stack_fffffffffffff358);
      amrex::ParmParse::get
                (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                 (double *)in_stack_fffffffffffff390,(int)((ulong)in_stack_fffffffffffff388 >> 0x20)
                );
    }
    std::__cxx11::string::~string(local_2e8);
  }
  local_be9 = false;
  if (-1 < RhoYdot_Type) {
    iVar6 = amrex::DescriptorList::size((DescriptorList *)0x4e579f);
    local_be9 = false;
    if ((iVar5 < iVar6) && (local_be9 = false, RhoYdot_Type != NavierStokesBase::Divu_Type)) {
      local_be9 = RhoYdot_Type != 0;
    }
  }
  local_310 = (uint)local_be9;
  amrex::ParmParse::query
            ((ParmParse *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8,
             (int *)in_stack_fffffffffffff3a0,(int)((ulong)in_stack_fffffffffffff398 >> 0x20));
  if ((anonymous_namespace)::chem_box_chop_threshold < 1) {
    (anonymous_namespace)::chem_box_chop_threshold = 4;
  }
  if (local_310 == 0) {
    local_18 = "PeleLM::init_once(): need RhoYdot_Type if do_chemistry";
    amrex::Error_host((char *)in_stack_fffffffffffff330);
  }
  this = amrex::DescriptorList::operator[]
                   ((DescriptorList *)in_stack_fffffffffffff320,
                    (int)((ulong)in_stack_fffffffffffff318 >> 0x20));
  iVar5 = amrex::StateDescriptor::nComp(this);
  if (iVar5 < 0x15) {
    local_20 = "PeleLM::init_once(): RhoYdot_Type needs NUM_SPECIES components";
    amrex::Error_host((char *)in_stack_fffffffffffff330);
  }
  if ((unity_Le != 0) && ((schmidt != prandtl || (NAN(schmidt) || NAN(prandtl))))) {
    if (NavierStokesBase::verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffff350,in_stack_fffffffffffff348);
      amrex::Print::operator<<(in_stack_fffffffffffff320,(char (*) [42])in_stack_fffffffffffff318);
      amrex::Print::operator<<(in_stack_fffffffffffff320,(char (*) [42])in_stack_fffffffffffff318);
      amrex::Print::operator<<(in_stack_fffffffffffff320,(char (*) [53])in_stack_fffffffffffff318);
      amrex::Print::operator<<(in_stack_fffffffffffff320,(char (*) [27])in_stack_fffffffffffff318);
      amrex::Print::operator<<(in_stack_fffffffffffff320,(char (*) [42])in_stack_fffffffffffff318);
      amrex::Print::~Print(in_stack_fffffffffffff390);
    }
    schmidt = prandtl;
  }
  NavierStokesBase::num_state_type = amrex::DescriptorList::size((DescriptorList *)0x4e59e9);
  if (NavierStokesBase::verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff350,in_stack_fffffffffffff348);
    amrex::Print::operator<<(in_stack_fffffffffffff320,(char (*) [39])in_stack_fffffffffffff318);
    amrex::Print::operator<<(in_stack_fffffffffffff320,(int *)in_stack_fffffffffffff318);
    local_621 = 10;
    amrex::Print::operator<<(in_stack_fffffffffffff320,(char *)in_stack_fffffffffffff318);
    amrex::Print::~Print(in_stack_fffffffffffff390);
  }
  amrex::ParmParse::query
            ((ParmParse *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8,
             (bool *)in_stack_fffffffffffff3a0,(int)((ulong)in_stack_fffffffffffff398 >> 0x20));
  if ((plot_reactions & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_648,"REACTIONS",&local_649);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)in_stack_fffffffffffff360,in_stack_fffffffffffff358);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff340,(size_type)in_stack_fffffffffffff338);
    std::__cxx11::string::~string(local_648);
    std::allocator<char>::~allocator((allocator<char> *)&local_649);
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff350,in_stack_fffffffffffff348);
    in_stack_fffffffffffff3b0 =
         amrex::Print::operator<<
                   (in_stack_fffffffffffff320,(char (*) [17])in_stack_fffffffffffff318);
    local_7dc = 0x54;
    in_stack_fffffffffffff3a8 =
         amrex::Print::operator<<(in_stack_fffffffffffff320,(int *)in_stack_fffffffffffff318);
    local_7dd = 10;
    amrex::Print::operator<<(in_stack_fffffffffffff320,(char *)in_stack_fffffffffffff318);
    amrex::Print::~Print(in_stack_fffffffffffff390);
    local_7e4 = 0;
    while( true ) {
      in_stack_fffffffffffff398 = (char *)(long)local_7e4;
      in_stack_fffffffffffff3a0 = (ParmParse *)local_809;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_809 + 1),"REACTIONS",(allocator *)in_stack_fffffffffffff3a0);
      this_00 = (Print *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                       *)in_stack_fffffffffffff360,in_stack_fffffffffffff358);
      LVar11 = amrex::
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x4e5c72);
      std::__cxx11::string::~string((string *)(local_809 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_809);
      if (LVar11 <= (long)in_stack_fffffffffffff398) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_850,"R",&local_851);
      amrex::Concatenate((string *)CONCAT17(uVar4,CONCAT16(uVar15,in_stack_fffffffffffff4f8)),
                         (int)((ulong)puVar14 >> 0x20),(int)puVar14);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_878,"REACTIONS",&local_879);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff360,in_stack_fffffffffffff358);
      pbVar12 = amrex::
                Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)in_stack_fffffffffffff320,(size_type)in_stack_fffffffffffff318);
      std::__cxx11::string::operator=((string *)pbVar12,local_830);
      std::__cxx11::string::~string(local_878);
      std::allocator<char>::~allocator((allocator<char> *)&local_879);
      std::__cxx11::string::~string(local_830);
      std::__cxx11::string::~string(local_850);
      std::allocator<char>::~allocator((allocator<char> *)&local_851);
      local_7e4 = local_7e4 + 1;
    }
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff350,in_stack_fffffffffffff348);
    in_stack_fffffffffffff360 =
         amrex::Print::operator<<
                   (in_stack_fffffffffffff320,(char (*) [49])in_stack_fffffffffffff318);
    local_a09 = 10;
    amrex::Print::operator<<(in_stack_fffffffffffff320,(char *)in_stack_fffffffffffff318);
    amrex::Print::~Print(this_00);
  }
  amrex::ParmParse::query
            ((ParmParse *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8,
             (bool *)in_stack_fffffffffffff3a0,(int)((ulong)in_stack_fffffffffffff398 >> 0x20));
  amrex::ParmParse::query
            ((ParmParse *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8,
             (bool *)in_stack_fffffffffffff3a0,(int)((ulong)in_stack_fffffffffffff398 >> 0x20));
  iVar5 = (int)((ulong)in_stack_fffffffffffff398 >> 0x20);
  if ((plot_consumption & 1U) != 0) {
    LVar11 = amrex::
             Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x4e5ff1);
    iVar5 = (int)((ulong)in_stack_fffffffffffff398 >> 0x20);
    if (0 < LVar11) {
      in_stack_fffffffffffff358 = (key_type *)local_a31;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_a31 + 1),"CONSUMPTION",(allocator *)in_stack_fffffffffffff358);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff360,in_stack_fffffffffffff358);
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x4e604f);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff340,(size_type)in_stack_fffffffffffff338);
      std::__cxx11::string::~string((string *)(local_a31 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_a31);
      local_a38 = 0;
      while( true ) {
        pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (long)local_a38;
        LVar11 = amrex::
                 Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x4e609c);
        iVar5 = (int)((ulong)in_stack_fffffffffffff398 >> 0x20);
        if (LVar11 <= (long)pbVar12) break;
        amrex::
        Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff320,(size_type)in_stack_fffffffffffff318);
        std::operator+(pbVar12,(char *)in_stack_fffffffffffff340);
        in_stack_fffffffffffff340 = &local_a79;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a78,"CONSUMPTION",in_stack_fffffffffffff340);
        in_stack_fffffffffffff338 =
             (string *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           *)in_stack_fffffffffffff360,in_stack_fffffffffffff358);
        pbVar12 = amrex::
                  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffff320,(size_type)in_stack_fffffffffffff318);
        std::__cxx11::string::operator=((string *)pbVar12,local_a58);
        std::__cxx11::string::~string(local_a78);
        std::allocator<char>::~allocator((allocator<char> *)&local_a79);
        std::__cxx11::string::~string(local_a58);
        local_a38 = local_a38 + 1;
      }
    }
  }
  amrex::ParmParse::query
            ((ParmParse *)in_stack_fffffffffffff3b0,(char *)in_stack_fffffffffffff3a8,
             (bool *)in_stack_fffffffffffff3a0,iVar5);
  if ((plot_heat_release & 1U) != 0) {
    paVar13 = &local_aa1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_aa0,"HEATRELEASE",paVar13);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)in_stack_fffffffffffff360,in_stack_fffffffffffff358);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff340,(size_type)in_stack_fffffffffffff338);
    std::__cxx11::string::~string(local_aa0);
    std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
    paVar13 = &local_ac9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffff538,"HEATRELEASE",paVar13);
    i_00 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)in_stack_fffffffffffff360,in_stack_fffffffffffff358);
    pbVar12 = amrex::
              Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)paVar13,(size_type)i_00);
    std::__cxx11::string::operator=((string *)pbVar12,"HeatRelease");
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff538);
    std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
  }
  init_once_done = 1;
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4e63e8);
  amrex::ParmParse::~ParmParse((ParmParse *)0x4e63f5);
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4e6402);
  return;
}

Assistant:

void
PeleLM::init_once ()
{
   //
   // Computes the static variables unique to PeleLM.
   // Check that (some) things are set up correctly.
   //
   int dummy_State_Type;

   int tTemp = -1;
   int have_temp = isStateVariable("temp", dummy_State_Type, tTemp);
   AMREX_ALWAYS_ASSERT(tTemp == Temp);

   have_temp = have_temp && State_Type == dummy_State_Type;
   int tRhoH = -1;
   have_temp = have_temp && isStateVariable("rhoh", dummy_State_Type, tRhoH);
   AMREX_ALWAYS_ASSERT(tRhoH == RhoH);
   have_temp = have_temp && State_Type == dummy_State_Type;

   int tRhoRT = -1;
   have_rhort = isStateVariable("RhoRT", dummy_State_Type, tRhoRT);
   AMREX_ALWAYS_ASSERT(tRhoRT == RhoRT);
   have_rhort = have_rhort && State_Type == dummy_State_Type;

   if (!have_temp)
     amrex::Abort("PeleLM::init_once(): RhoH & Temp must both be the state");

   if (Temp < RhoH)
     amrex::Abort("PeleLM::init_once(): must have RhoH < Temp");
   //
   // Temperature must be non-conservative, rho*h must be conservative.
   //
   if (advectionType[Temp] == Conservative)
     amrex::Abort("PeleLM::init_once(): Temp must be non-conservative");

   if (advectionType[RhoH] != Conservative)
     amrex::Abort("PeleLM::init_once(): RhoH must be conservative");
   //
   // Species checks.
   //
   AMREX_ASSERT(Temp > RhoH && RhoH > Density);
   //
   // Here we want to count relative to Density instead of relative
   // to RhoH, so we can put RhoH after the species instead of before.
   // This logic should work in both cases.
   last_spec  = first_spec + NUM_SPECIES - 1;

   for (int i = first_spec; i <= last_spec; i++)
      if (advectionType[i] != Conservative)
         amrex::Error("PeleLM::init_once: species must be conservative");

   int diffuse_spec = is_diffusive[first_spec];
   for (int i = first_spec+1; i <= last_spec; i++) {
      if (is_diffusive[i] != diffuse_spec) {
         amrex::Error("PeleLM::init_once: Le != 1; diffuse");
      }
   }

   //
   // make space for typical values
   //
   typical_values.resize(NUM_STATE,-1); // -ve means don't use for anything
   typical_values[RhoH] = typical_RhoH_value_default;

   Vector<std::string> specNames;
   pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(specNames);
   ParmParse pp("ht");
   for (int i=0; i<NUM_SPECIES; ++i) {
     const std::string ppStr = std::string("typValY_") + specNames[i];
     if (pp.countval(ppStr.c_str())>0) {
       pp.get(ppStr.c_str(),typical_values_FileVals[specNames[i]]);
     }
   }
   Vector<std::string> otherKeys = {"Temp", "RhoH", "Vel"};
   for (int i=0; i<otherKeys.size(); ++i) {
     const std::string ppStr(std::string("typVal_")+otherKeys[i]);
     if (pp.countval(ppStr.c_str())>0) {
       pp.get(ppStr.c_str(),typical_values_FileVals[otherKeys[i]]);
     }
   }

   //
   // Chemistry.
   //
   int ydot_good = RhoYdot_Type >= 0 && RhoYdot_Type <  desc_lst.size()
                                     && RhoYdot_Type != Divu_Type
                                     && RhoYdot_Type != State_Type;


   //
   // This is the minimum number of boxes per MPI proc that I want
   // when chopping up chemistry work.
   //
   pp.query("chem_box_chop_threshold",chem_box_chop_threshold);

   if (chem_box_chop_threshold <= 0)
   {
#ifdef AMREX_USE_OMP
     chem_box_chop_threshold = 8;
#else
     chem_box_chop_threshold = 4;
#endif
   }

   if (!ydot_good)
      amrex::Error("PeleLM::init_once(): need RhoYdot_Type if do_chemistry");

   if (desc_lst[RhoYdot_Type].nComp() < NUM_SPECIES)
      amrex::Error("PeleLM::init_once(): RhoYdot_Type needs NUM_SPECIES components");
   //
   // Enforce Le = 1, unless !unity_Le
   //
   if (unity_Le && (schmidt != prandtl) )
   {
      if (verbose)
        amrex::Print() << "**************** WARNING ***************\n"
                       << "PeleLM::init_once() : currently must have"
                       << "equal Schmidt and Prandtl numbers unless !unity_Le.\n"
                       << "Setting Schmidt = Prandtl\n"
                       << "**************** WARNING ***************\n";
      schmidt = prandtl;
   }
   //
   // We are done.
   //
   num_state_type = desc_lst.size();

   if (verbose)
      amrex::Print() << "PeleLM::init_once(): num_state_type = " << num_state_type << '\n';

   pp.query("plot_reactions",plot_reactions);
   if (plot_reactions)
   {
      auxDiag_names["REACTIONS"].resize(NUM_REACTIONS);
      amrex::Print() << "NUM_REACTIONS = "<< NUM_REACTIONS << '\n';
      for (int i = 0; i < auxDiag_names["REACTIONS"].size(); ++i)
         auxDiag_names["REACTIONS"][i] = amrex::Concatenate("R",i+1);
      amrex::Print() << "***** Make sure to increase amr.regrid_int !!!!!" << '\n';
   }

   pp.query("plot_consumption",plot_consumption);
   pp.query("plot_auxDiags",plot_consumption); // This is for backward comptibility - FIXME
   if (plot_consumption && consumptionName.size()>0)
   {
      auxDiag_names["CONSUMPTION"].resize(consumptionName.size());
      for (int j=0; j<consumptionName.size(); ++j)
      {
         auxDiag_names["CONSUMPTION"][j] = consumptionName[j] + "_ConsumptionRate";
      }
   }

   pp.query("plot_heat_release",plot_heat_release);
   if (plot_heat_release)
   {
      auxDiag_names["HEATRELEASE"].resize(1);
      auxDiag_names["HEATRELEASE"][0] = "HeatRelease";
   }

   init_once_done = 1;
}